

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AddAnnotation
          (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this,size_t begin_offset,
          size_t end_offset,string *file_path,vector<int,_std::allocator<int>_> *path,
          optional<google::protobuf::io::AnnotationCollector::Semantic> semantic)

{
  optional<google::protobuf::io::AnnotationCollector::Semantic> value;
  bool bVar1;
  GeneratedCodeInfo_Annotation *this_00;
  reference piVar2;
  uint32_t *puVar3;
  Arena *arena;
  Semantic *pSVar4;
  const_iterator cStack_70;
  int segment;
  const_iterator __end3;
  const_iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  GeneratedCodeInfo_Annotation *annotation;
  vector<int,_std::allocator<int>_> *path_local;
  string *file_path_local;
  size_t end_offset_local;
  size_t begin_offset_local;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this_local;
  optional<google::protobuf::io::AnnotationCollector::Semantic> semantic_local;
  
  this_local = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
               semantic.
               super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
               ._M_payload.
               super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>;
  this_00 = GeneratedCodeInfo::add_annotation(this->annotation_proto_);
  __end3 = std::vector<int,_std::allocator<int>_>::begin(path);
  cStack_70 = std::vector<int,_std::allocator<int>_>::end(path);
  while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff90), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end3);
    GeneratedCodeInfo_Annotation::add_path(this_00,*piVar2);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end3);
  }
  semantic_local.
  super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> =
       (_Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>)
       (_Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>)file_path;
  puVar3 = protobuf::internal::HasBits<1>::operator[](&(this_00->field_0)._impl_._has_bits_,0);
  value.super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> =
       semantic_local.
       super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>.
       _M_payload.super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>;
  *puVar3 = *puVar3 | 1;
  arena = protobuf::MessageLite::GetArena((MessageLite *)this_00);
  protobuf::internal::ArenaStringPtr::Set<>
            (&(this_00->field_0)._impl_.source_file_,
             (string *)
             value.
             super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>.
             _M_payload.
             super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>,arena
            );
  GeneratedCodeInfo_Annotation::set_begin(this_00,(int32_t)begin_offset);
  GeneratedCodeInfo_Annotation::set_end(this_00,(int32_t)end_offset);
  bVar1 = std::optional<google::protobuf::io::AnnotationCollector::Semantic>::has_value
                    ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&this_local);
  if (bVar1) {
    pSVar4 = std::optional<google::protobuf::io::AnnotationCollector::Semantic>::operator*
                       ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&this_local
                       );
    SetSemantic<google::protobuf::GeneratedCodeInfo_Annotation>(this_00,*pSVar4);
  }
  return;
}

Assistant:

void AddAnnotation(size_t begin_offset, size_t end_offset,
                     const std::string& file_path, const std::vector<int>& path,
                     absl::optional<Semantic> semantic) override {
    auto* annotation = annotation_proto_->add_annotation();
    for (const int segment : path) {
      annotation->add_path(segment);
    }
    annotation->set_source_file(file_path);
    annotation->set_begin(begin_offset);
    annotation->set_end(end_offset);

    if (semantic.has_value()) {
      SetSemantic(annotation, *semantic, Rank1{});
    }
  }